

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CopyClassExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CopyClassExpressionSyntax,slang::syntax::CopyClassExpressionSyntax_const&>
          (BumpAllocator *this,CopyClassExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  NameSyntax *pNVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  CopyClassExpressionSyntax *pCVar5;
  
  pCVar5 = (CopyClassExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CopyClassExpressionSyntax *)this->endPtr < pCVar5 + 1) {
    pCVar5 = (CopyClassExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pCVar5 + 1);
  }
  (pCVar5->expr).ptr = (args->expr).ptr;
  SVar3 = (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  pNVar2 = (args->scopedNew).ptr;
  (pCVar5->super_ExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  (pCVar5->scopedNew).ptr = pNVar2;
  (pCVar5->super_ExpressionSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pCVar5->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar5->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pCVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }